

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O0

void __thiscall
MethodProperty_MoveTo_Test::~MethodProperty_MoveTo_Test(MethodProperty_MoveTo_Test *this)

{
  MethodProperty_MoveTo_Test *this_local;
  
  ~MethodProperty_MoveTo_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MethodProperty, MoveTo)
{
  MethodMovableType obj;
  Movable move_from;
  auto remembered_value = move_from.getId();
  // const T& setter - value won't be moved
  obj.value1 = std::move( move_from );
  EXPECT_NE( remembered_value, obj.m_value1.getId() );
  EXPECT_NE( 0, obj.m_value1.getId() );
  EXPECT_EQ( remembered_value, move_from.getId() );
  
  Movable move_from2;
  remembered_value = move_from2.getId();
  obj.value2 = std::move( move_from2 );
  EXPECT_EQ( remembered_value, obj.m_value2.getId() );
  EXPECT_EQ( 0, move_from2.getId() );
  
  Movable move_from3;
  remembered_value = move_from3.getId();
  obj.value4 = std::move( move_from3 );
  EXPECT_EQ( remembered_value, obj.m_value4.getId() );
  EXPECT_EQ( 0, move_from3.getId() );
  
  IdHolder move_from_other;
  remembered_value = move_from_other.id;
  // const T& setter - value won't be moved
  obj.value1 = std::move( move_from_other );
  EXPECT_NE( remembered_value, obj.m_value1.getId() );
  EXPECT_NE( 0, obj.m_value1.getId() );
  // moved from during conversion, not in setter
  EXPECT_EQ( 0, move_from_other.id );
  
  IdHolder move_from_other2;
  remembered_value = move_from_other2.id;
  obj.value2 = std::move( move_from_other2 );
  EXPECT_EQ( remembered_value, obj.m_value2.getId() );
  EXPECT_EQ( 0, move_from_other2.id );
  
  IdHolder move_from_other3;
  remembered_value = move_from_other3.id;
  obj.value4 = std::move( move_from_other3 );
  EXPECT_EQ( remembered_value, obj.m_value4.getId() );
  EXPECT_EQ( 0, move_from_other3.id );
}